

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,REF_CELL *ref_cell_ptr)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  REF_CELL pRVar3;
  REF_INT RVar4;
  int cell;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  uVar1 = ref_cell_deep_copy(ref_cell_ptr,ref_grid->cell[8]);
  if (uVar1 == 0) {
    ref_cell = *ref_cell_ptr;
    pRVar3 = ref_grid->cell[9];
    if (0 < pRVar3->max) {
      RVar4 = 0;
      do {
        RVar2 = ref_cell_nodes(pRVar3,RVar4,local_a8);
        if ((RVar2 == 0) &&
           (uVar1 = ref_shard_add_pyr_as_tet(ref_grid->node,ref_cell,local_a8,0), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x48c,"ref_shard_extract_tet",(ulong)uVar1,"converts pyr to tets");
          return uVar1;
        }
        RVar4 = RVar4 + 1;
        pRVar3 = ref_grid->cell[9];
      } while (RVar4 < pRVar3->max);
    }
    pRVar3 = ref_grid->cell[10];
    if (0 < pRVar3->max) {
      RVar4 = 0;
      do {
        RVar2 = ref_cell_nodes(pRVar3,RVar4,local_a8);
        if ((RVar2 == 0) &&
           (uVar1 = ref_shard_add_pri_as_tet(ref_grid->node,ref_cell,local_a8,0), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x492,"ref_shard_extract_tet",(ulong)uVar1,"converts pri to tets");
          return uVar1;
        }
        RVar4 = RVar4 + 1;
        pRVar3 = ref_grid->cell[10];
      } while (RVar4 < pRVar3->max);
    }
    pRVar3 = ref_grid->cell[0xb];
    if (0 < pRVar3->max) {
      cell = 0;
      do {
        RVar2 = ref_cell_nodes(pRVar3,cell,local_a8);
        if ((RVar2 == 0) &&
           (uVar1 = ref_shard_add_hex_as_tet(ref_grid->node,ref_cell,local_a8), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x497,"ref_shard_extract_tet",(ulong)uVar1,"converts hex to tets");
          return uVar1;
        }
        cell = cell + 1;
        pRVar3 = ref_grid->cell[0xb];
      } while (cell < pRVar3->max);
    }
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x485,
           "ref_shard_extract_tet",(ulong)uVar1,"deep tri copy");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,
                                         REF_CELL *ref_cell_ptr) {
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_BOOL check_volume = REF_FALSE;
  REF_BOOL check_faces = REF_FALSE;

  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_grid_tet(ref_grid)), "orig tet");

  RSS(ref_cell_deep_copy(ref_cell_ptr, ref_grid_tet(ref_grid)),
      "deep tri copy");
  ref_cell = *ref_cell_ptr;
  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_cell), "deep copy tet");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pyr to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pyr");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pri to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pri");
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_grid_node(ref_grid), ref_cell, nodes),
        "converts hex to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add hex");

  return REF_SUCCESS;
}